

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_33b920::ExchangeSectionFixups::ExchangeSectionFixups(ExchangeSectionFixups *this)

{
  shared_ptr<pstore::file::in_memory> *file;
  ExchangeSectionFixups *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ExchangeSectionFixups_003f4d88;
  in_memory_store::in_memory_store(&this->db_storage_);
  file = in_memory_store::file(&this->db_storage_);
  pstore::database::database<pstore::file::in_memory>(&this->db_,file,true);
  pstore::database::set_vacuum_mode(&this->db_,disabled);
  return;
}

Assistant:

ExchangeSectionFixups ()
                : db_storage_{}
                , db_{db_storage_.file ()} {
            db_.set_vacuum_mode (pstore::database::vacuum_mode::disabled);
        }